

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Unicode.hpp
# Opt level: O0

bool cppjieba::DecodeUTF8RunesInString(char *s,size_t len,Unicode *unicode)

{
  bool bVar1;
  LocalVector<cppjieba::RuneStr> *pLVar2;
  uint *in_RDX;
  size_t i;
  RuneStrArray runes;
  uint *puVar3;
  LocalVector<cppjieba::RuneStr> *in_stack_fffffffffffffe50;
  LocalVector<cppjieba::RuneStr> *pLVar4;
  undefined7 in_stack_fffffffffffffe68;
  undefined1 in_stack_fffffffffffffe6f;
  size_t in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe7c;
  LocalVector<cppjieba::RuneStr> local_178;
  uint *local_20;
  byte local_1;
  
  local_20 = in_RDX;
  limonp::LocalVector<unsigned_int>::clear((LocalVector<unsigned_int> *)in_stack_fffffffffffffe50);
  pLVar4 = &local_178;
  limonp::LocalVector<cppjieba::RuneStr>::LocalVector(pLVar4);
  bVar1 = DecodeUTF8RunesInString
                    ((char *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                     in_stack_fffffffffffffe70,
                     (RuneStrArray *)CONCAT17(in_stack_fffffffffffffe6f,in_stack_fffffffffffffe68));
  if (bVar1) {
    puVar3 = local_20;
    limonp::LocalVector<cppjieba::RuneStr>::size(&local_178);
    limonp::LocalVector<unsigned_int>::reserve((LocalVector<unsigned_int> *)pLVar4,(size_t)puVar3);
    in_stack_fffffffffffffe50 = (LocalVector<cppjieba::RuneStr> *)0x0;
    while( true ) {
      pLVar4 = in_stack_fffffffffffffe50;
      pLVar2 = (LocalVector<cppjieba::RuneStr> *)
               limonp::LocalVector<cppjieba::RuneStr>::size(&local_178);
      if (pLVar2 <= in_stack_fffffffffffffe50) break;
      puVar3 = local_20;
      limonp::LocalVector<cppjieba::RuneStr>::operator[](&local_178,(size_t)pLVar4);
      limonp::LocalVector<unsigned_int>::push_back
                ((LocalVector<unsigned_int> *)in_stack_fffffffffffffe50,puVar3);
      in_stack_fffffffffffffe50 =
           (LocalVector<cppjieba::RuneStr> *)((long)&pLVar4->buffer_[0].rune + 1);
    }
    local_1 = 1;
  }
  else {
    local_1 = 0;
  }
  limonp::LocalVector<cppjieba::RuneStr>::~LocalVector(in_stack_fffffffffffffe50);
  return (bool)(local_1 & 1);
}

Assistant:

inline bool DecodeUTF8RunesInString(const char* s, size_t len, Unicode& unicode) {
  unicode.clear();
  RuneStrArray runes;
  if (!DecodeUTF8RunesInString(s, len, runes)) {
    return false;
  }
  unicode.reserve(runes.size());
  for (size_t i = 0; i < runes.size(); i++) {
    unicode.push_back(runes[i].rune);
  }
  return true;
}